

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.cpp
# Opt level: O3

void __thiscall Lexer::add_token_comment(Lexer *this)

{
  size_type sVar1;
  pointer pcVar2;
  pointer puVar3;
  pointer pTVar4;
  TokenKind local_1c;
  unsigned_long local_18;
  unsigned_long local_10;
  
  trim_string(&this->tok_id);
  sVar1 = (this->tok_id)._M_string_length;
  if (sVar1 != 0) {
    pcVar2 = (this->tok_id)._M_dataplus._M_p;
    std::vector<unsigned_char,std::allocator<unsigned_char>>::_M_range_insert<unsigned_char*>
              ((vector<unsigned_char,std::allocator<unsigned_char>> *)&(this->data).comments,
               (this->data).comments.
               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_finish,pcVar2,pcVar2 + sVar1);
    puVar3 = (this->data).comments.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pTVar4 = (this->data).tokens.super__Vector_base<Token,_std::allocator<Token>_>._M_impl.
             super__Vector_impl_data._M_finish;
    if (((this->data).tokens.super__Vector_base<Token,_std::allocator<Token>_>._M_impl.
         super__Vector_impl_data._M_start == pTVar4) || (pTVar4[-1].kind != Comment)) {
      local_1c = Comment;
      local_18 = (long)(this->data).comments.
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data._M_finish - (long)puVar3;
      local_10 = local_18 - (this->tok_id)._M_string_length;
      std::vector<Token,std::allocator<Token>>::
      emplace_back<TokenKind,TextPos_const&,unsigned_long,unsigned_long>
                ((vector<Token,std::allocator<Token>> *)&(this->data).tokens,&local_1c,
                 &(this->reader).pos_,&local_10,&local_18);
    }
    else {
      pTVar4[-1].j = *(int *)&(this->data).comments.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_finish - (int)puVar3;
    }
    (this->tok_id)._M_string_length = 0;
    *(this->tok_id)._M_dataplus._M_p = '\0';
  }
  return;
}

Assistant:

void Lexer::add_token_comment()
{
  trim_string(tok_id);
  if (!tok_id.empty()) {
    data.comments.insert(data.comments.end(),
                         (uint8_t*)&tok_id[0],
                         (uint8_t*)&tok_id[0]+tok_id.size());

    // Merge comments
    if (!data.tokens.empty() &&
        data.tokens.back().kind == TokenKind::Comment) {
      data.tokens.back().j = data.comments.size();
    }
    else {
      data.add_token(TokenKind::Comment,
                     reader.pos(),
                     data.comments.size()-tok_id.size(),
                     data.comments.size());
    }

    tok_id.clear();
  }
}